

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O0

bool __thiscall xemmai::io::t_writer::f_write(t_writer *this,t_io *a_library)

{
  t_object *ptVar1;
  t_bytes *this_00;
  t_object *ptVar2;
  t_type tVar3;
  size_t sVar4;
  bool bVar5;
  long local_68;
  t_value<xemmai::t_pointer> local_60;
  undefined1 local_50 [24];
  t_value<xemmai::t_pointer> n;
  char *p;
  t_bytes *buffer;
  t_io *a_library_local;
  t_writer *this_local;
  
  ptVar1 = t_slot::operator->(&this->v_buffer);
  this_00 = t_object::f_as<xemmai::t_bytes>(ptVar1);
  n.field_0 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)
              t_bytes::operator[](this_00,0);
  if (this->v_remain == (char *)0x0) {
    this->v_remain = (char *)n.field_0;
  }
  ptVar1 = t_slot::operator_cast_to_t_object_(&this->v_stream);
  t_value<xemmai::t_pointer>::t_pointer((t_value<xemmai::t_pointer> *)local_50,ptVar1);
  ptVar1 = t_io::f_symbol_write(a_library);
  ptVar2 = t_slot::operator_cast_to_t_object_(&this->v_buffer);
  t_value<xemmai::t_pointer>::t_pointer(&local_60,ptVar2);
  local_68 = (long)this->v_remain - (long)n.field_0;
  t_value<xemmai::t_pointer>::f_invoke<xemmai::t_value<xemmai::t_pointer>,long,long>
            ((t_value<xemmai::t_pointer> *)(local_50 + 0x10),(t_object *)local_50,(size_t *)ptVar1,
             (t_value<xemmai::t_pointer> *)&f_write::index,(long *)&local_60,&local_68);
  ptVar1 = t_pointer::operator_cast_to_t_object_((t_pointer *)(local_50 + 0x10));
  f_check<unsigned_long>(ptVar1,L"result of write");
  tVar3 = f_as<unsigned_long,xemmai::t_value<xemmai::t_pointer>&>
                    ((t_value<xemmai::t_pointer> *)(local_50 + 0x10));
  this->v_remain = this->v_remain + tVar3;
  bVar5 = this->v_p1 <= this->v_remain;
  if (bVar5) {
    this->v_p1 = (char *)n.field_0;
    sVar4 = t_bytes::f_size(this_00);
    this->v_n1 = sVar4;
    this->v_remain = (char *)0x0;
  }
  return bVar5;
}

Assistant:

bool t_writer::f_write(t_io* a_library)
{
	auto& buffer = v_buffer->f_as<t_bytes>();
	auto p = reinterpret_cast<char*>(&buffer[0]);
	if (!v_remain) v_remain = p;
	static size_t index;
	auto n = t_pvalue(v_stream).f_invoke(a_library->f_symbol_write(), index, t_pvalue(v_buffer), v_remain - p, v_p1 - v_remain);
	f_check<size_t>(n, L"result of write");
	v_remain += f_as<size_t>(n);
	if (v_remain < v_p1) return false;
	v_p1 = p;
	v_n1 = buffer.f_size();
	v_remain = nullptr;
	return true;
}